

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_key_schedule_t *sched;
  ptls_cipher_suite_t *cs;
  ptls_iovec_t ikm;
  int iVar1;
  uint8_t *puVar2;
  size_t msglen;
  ptls_iovec_t pVar3;
  byte local_c9;
  size_t local_c8;
  size_t confirm_hash_off_1;
  size_t local_b0;
  size_t confirm_hash_off;
  undefined1 auStack_a0 [4];
  int ret;
  ptls_iovec_t ecdh_secret;
  st_ptls_server_hello_t sh;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  msglen = message.len;
  puVar2 = message.base;
  memset(auStack_a0,0,0x10);
  confirm_hash_off._4_4_ =
       decode_server_hello(tls,(st_ptls_server_hello_t *)&ecdh_secret.len,puVar2 + 4,puVar2 + msglen
                          );
  if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
  if ((sh.legacy_session_id.base != (uint8_t *)(tls->field_19).client.legacy_session_id.len) ||
     (iVar1 = (*ptls_mem_equal)((void *)sh.random_._24_8_,
                                (tls->field_19).client.legacy_session_id.base,
                                (tls->field_19).client.legacy_session_id.len), iVar1 == 0)) {
    confirm_hash_off._4_4_ = 0x2f;
    goto LAB_001390e8;
  }
  if ((int)sh.legacy_session_id.len != 0) {
    confirm_hash_off._4_4_ =
         key_schedule_select_cipher
                   (tls->key_schedule,tls->cipher_suite,0,(tls->ctx->pre_shared_key).secret);
    if (confirm_hash_off._4_4_ == 0) {
      key_schedule_transform_post_ch1hash(tls->key_schedule);
      if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
        local_b0 = 0;
        if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) ==
            (undefined1  [112])0x0) {
          if ((*(byte *)&tls->ech >> 1 & 1) == 0) {
            __assert_fail("tls->ech.offered_grease",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                          ,0xb12,
                          "int client_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
        }
        else if (sh.field_3.retry_request.cookie.len != 0) {
          local_b0 = sh.field_3.retry_request.cookie.len - (long)puVar2;
        }
        confirm_hash_off._4_4_ =
             client_ech_select_hello(tls,message,local_b0,"hrr ech accept confirmation");
        if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
      }
      ptls__key_schedule_update_hash(tls->key_schedule,puVar2,msglen,0);
      iVar1 = handle_hello_retry_request
                        (tls,emitter,(st_ptls_server_hello_t *)&ecdh_secret.len,message,properties);
      return iVar1;
    }
    goto LAB_001390e8;
  }
  sched = tls->key_schedule;
  cs = tls->cipher_suite;
  local_c9 = 0;
  if (((tls->field_19).server.pending_traffic_secret[0x38] & 1) != 0) {
    local_c9 = ((byte)tls->field_0x1e8 >> 1 & 1) != 0 ^ 0xff;
  }
  pVar3 = ptls_iovec_init((void *)0x0,0);
  confirm_hash_off._4_4_ = key_schedule_select_cipher(sched,cs,(uint)(local_c9 & 1),pVar3);
  if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
  if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
    local_c8 = 0;
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) ==
        (undefined1  [112])0x0) {
      if ((*(byte *)&tls->ech >> 1 & 1) == 0) {
        __assert_fail("tls->ech.offered_grease",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0xb26,
                      "int client_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
    }
    else {
      local_c8 = 0x1e;
    }
    confirm_hash_off._4_4_ = client_ech_select_hello(tls,message,local_c8,"ech accept confirmation")
    ;
    if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
  }
  clear_ech(&tls->ech,0);
  if (tls->key_schedule->hashes[0].ctx_outer != (ptls_hash_context_t *)0x0) {
    (*(tls->key_schedule->hashes[0].ctx_outer)->final)
              (tls->key_schedule->hashes[0].ctx_outer,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx_outer = (ptls_hash_context_t *)0x0;
  }
  if (((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0) &&
     (((byte)tls->field_0x1e8 >> 1 & 1) == 0)) {
    confirm_hash_off._4_4_ = 0x28;
    goto LAB_001390e8;
  }
  ptls__key_schedule_update_hash(tls->key_schedule,puVar2,msglen,0);
  if ((sh._48_8_ != 0) &&
     (pVar3.len = (size_t)sh.field_3.peerkey.base, pVar3.base = (uint8_t *)sh._48_8_,
     confirm_hash_off._4_4_ =
          (*((tls->field_19).client.key_share_ctx)->on_exchange)
                    (&(tls->field_19).client.key_share_ctx,1,(ptls_iovec_t *)auStack_a0,pVar3),
     confirm_hash_off._4_4_ != 0)) {
    if (_auStack_a0 != (uint8_t *)0x0) {
      __assert_fail("ecdh_secret.base == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0xb3d,
                    "int client_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    goto LAB_001390e8;
  }
  ikm.len = (size_t)ecdh_secret.base;
  ikm.base = _auStack_a0;
  confirm_hash_off._4_4_ = key_schedule_extract(tls->key_schedule,ikm);
  if ((confirm_hash_off._4_4_ != 0) ||
     (confirm_hash_off._4_4_ = setup_traffic_protection(tls,0,"s hs traffic",2,0,0),
     confirm_hash_off._4_4_ != 0)) goto LAB_001390e8;
  if (((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1) == 0) {
    confirm_hash_off._4_4_ = setup_traffic_protection(tls,1,"c hs traffic",2,0,0);
joined_r0x001390cd:
    if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
  }
  else {
    puVar2 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      confirm_hash_off._4_4_ = 0x201;
      goto LAB_001390e8;
    }
    confirm_hash_off._4_4_ =
         derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if (confirm_hash_off._4_4_ != 0) goto LAB_001390e8;
    if (tls->ctx->update_traffic_key != (ptls_update_traffic_key_t *)0x0) {
      confirm_hash_off._4_4_ =
           (*tls->ctx->update_traffic_key->cb)
                     (tls->ctx->update_traffic_key,tls,1,2,tls->pending_handshake_secret);
      goto joined_r0x001390cd;
    }
  }
  tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
  confirm_hash_off._4_4_ = 0x202;
LAB_001390e8:
  if (_auStack_a0 != (uint8_t *)0x0) {
    (*ptls_clear_memory)(_auStack_a0,(size_t)ecdh_secret.base);
    free(_auStack_a0);
  }
  return confirm_hash_off._4_4_;
}

Assistant:

static int client_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
    struct st_ptls_server_hello_t sh;
    ptls_iovec_t ecdh_secret = {NULL};
    int ret;

    if ((ret = decode_server_hello(tls, &sh, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        goto Exit;
    if (!(sh.legacy_session_id.len == tls->client.legacy_session_id.len &&
          ptls_mem_equal(sh.legacy_session_id.base, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len))) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    if (sh.is_retry_request) {
        if ((ret = key_schedule_select_cipher(tls->key_schedule, tls->cipher_suite, 0, tls->ctx->pre_shared_key.secret)) != 0)
            goto Exit;
        key_schedule_transform_post_ch1hash(tls->key_schedule);
        if (tls->ech.aead != NULL) {
            size_t confirm_hash_off = 0;
            if (tls->ech.offered) {
                if (sh.retry_request.ech != NULL)
                    confirm_hash_off = sh.retry_request.ech - message.base;
            } else {
                assert(tls->ech.offered_grease);
            }
            if ((ret = client_ech_select_hello(tls, message, confirm_hash_off, ECH_CONFIRMATION_HRR)) != 0)
                goto Exit;
        }
        ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len, 0);
        return handle_hello_retry_request(tls, emitter, &sh, message, properties);
    }

    if ((ret = key_schedule_select_cipher(tls->key_schedule, tls->cipher_suite, tls->client.offered_psk && !tls->is_psk_handshake,
                                          ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;

    /* check if ECH is accepted */
    if (tls->ech.aead != NULL) {
        size_t confirm_hash_off = 0;
        if (tls->ech.offered) {
            confirm_hash_off =
                PTLS_HANDSHAKE_HEADER_SIZE + 2 /* legacy_version */ + PTLS_HELLO_RANDOM_SIZE - PTLS_ECH_CONFIRM_LENGTH;
        } else {
            assert(tls->ech.offered_grease);
        }
        if ((ret = client_ech_select_hello(tls, message, confirm_hash_off, ECH_CONFIRMATION_SERVER_HELLO)) != 0)
            goto Exit;
    }

    /* clear sensitive and space-consuming ECH state, now that are done with handling sending and decoding Hellos */
    clear_ech(&tls->ech, 0);
    if (tls->key_schedule->hashes[0].ctx_outer != NULL) {
        tls->key_schedule->hashes[0].ctx_outer->final(tls->key_schedule->hashes[0].ctx_outer, NULL, PTLS_HASH_FINAL_MODE_FREE);
        tls->key_schedule->hashes[0].ctx_outer = NULL;
    }

    /* if the client offered external PSK but the server did not use that, we call it a handshake failure */
    if (tls->ctx->pre_shared_key.identity.base != NULL && !tls->is_psk_handshake) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len, 0);

    if (sh.peerkey.base != NULL) {
        if ((ret = tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, &ecdh_secret, sh.peerkey)) != 0) {
            assert(ecdh_secret.base == NULL);
            goto Exit;
        }
    }

    if ((ret = key_schedule_extract(tls->key_schedule, ecdh_secret)) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s hs traffic", 2, 0, 0)) != 0)
        goto Exit;
    if (tls->client.using_early_data) {
        if ((tls->pending_handshake_secret = malloc(PTLS_MAX_DIGEST_SIZE)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = derive_secret(tls->key_schedule, tls->pending_handshake_secret, "c hs traffic")) != 0)
            goto Exit;
        if (tls->ctx->update_traffic_key != NULL &&
            (ret = tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, 1, 2, tls->pending_handshake_secret)) != 0)
            goto Exit;
    } else {
        if ((ret = setup_traffic_protection(tls, 1, "c hs traffic", 2, 0, 0)) != 0)
            goto Exit;
    }

    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (ecdh_secret.base != NULL) {
        ptls_clear_memory(ecdh_secret.base, ecdh_secret.len);
        free(ecdh_secret.base);
    }
    return ret;
}